

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::PrimitiveFieldGenerator
          (PrimitiveFieldGenerator *this,FieldDescriptor *descriptor,int presenceIndex,
          Options *options)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FieldDescriptor FVar1;
  char cVar2;
  string property_name;
  long *local_110;
  size_t local_108;
  long local_100 [2];
  undefined1 local_f0 [32];
  AlphaNum local_d0;
  AlphaNum local_a0;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_70;
  AlphaNum local_58;
  
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,presenceIndex,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__PrimitiveOneofFieldGenerator_0051f5f8;
  FVar1 = descriptor[2];
  if (FVar1 == (FieldDescriptor)0x9) {
    this->is_value_type = false;
  }
  else {
    this->is_value_type = FVar1 != (FieldDescriptor)0xc;
    if (FVar1 != (FieldDescriptor)0xc) {
      return;
    }
  }
  if (((this->super_FieldGeneratorBase).descriptor_[2] != (FieldDescriptor)0xb) &&
     (cVar2 = google::protobuf::FieldDescriptor::has_presence(), cVar2 != '\0')) {
    return;
  }
  this_00 = &(this->super_FieldGeneratorBase).variables_;
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_a0,this_00,(char (*) [14])0x400b63);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,*(long *)(local_a0.piece_._M_str + 0x10),
             *(long *)(local_a0.piece_._M_str + 0x18) + *(long *)(local_a0.piece_._M_str + 0x10));
  local_a0.piece_._M_len = local_108;
  local_a0.piece_._M_str = (char *)local_110;
  local_58.piece_._M_len = 0xc;
  local_58.piece_._M_str = ".Length != 0";
  absl::lts_20240722::StrCat_abi_cxx11_(&local_d0,&local_a0);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[19]>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_f0,this_00,(char (*) [19])0x400ac4);
  std::__cxx11::string::operator=((string *)(local_f0._8_8_ + 0x10),(string *)&local_d0);
  if ((char *)local_d0.piece_._M_len != local_d0.digits_) {
    operator_delete((void *)local_d0.piece_._M_len,local_d0.digits_._0_8_ + 1);
  }
  local_a0.piece_._M_len = 6;
  local_a0.piece_._M_str = "other.";
  local_58.piece_._M_len = local_108;
  local_58.piece_._M_str = (char *)local_110;
  local_d0.piece_._M_len = 0xc;
  local_d0.piece_._M_str = ".Length != 0";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_f0,&local_a0,&local_58);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[25]>(&local_70,this_00,(char (*) [25])"other_has_property_check")
  ;
  std::__cxx11::string::operator=
            ((string *)((long)local_70.first.field_1.slot_ + 0x10),(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  return;
}

Assistant:

PrimitiveFieldGenerator::PrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, int presenceIndex, const Options *options)
    : FieldGeneratorBase(descriptor, presenceIndex, options) {
  // TODO: Make this cleaner...
  is_value_type = descriptor->type() != FieldDescriptor::TYPE_STRING
      && descriptor->type() != FieldDescriptor::TYPE_BYTES;
  if (!is_value_type && !SupportsPresenceApi(descriptor_)) {
    std::string property_name = variables_["property_name"];
    variables_["has_property_check"] =
        absl::StrCat(property_name, ".Length != 0");
    variables_["other_has_property_check"] =
        absl::StrCat("other.", property_name, ".Length != 0");
  }
}